

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O3

Vec_Int_t * Ssw_MatchingPairs(Aig_Man_t *p0,Aig_Man_t *p1)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  Vec_Int_t *p;
  int *piVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  Vec_Ptr_t *pVVar8;
  
  if (p0->nObjs[2] != p1->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(p0) == Aig_ManCiNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswIslands.c"
                  ,0x152,"Vec_Int_t *Ssw_MatchingPairs(Aig_Man_t *, Aig_Man_t *)");
  }
  if (p0->nObjs[3] != p1->nObjs[3]) {
    __assert_fail("Aig_ManCoNum(p0) == Aig_ManCoNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswIslands.c"
                  ,0x153,"Vec_Int_t *Ssw_MatchingPairs(Aig_Man_t *, Aig_Man_t *)");
  }
  if (p0->nRegs != p1->nRegs) {
    __assert_fail("Aig_ManRegNum(p0) == Aig_ManRegNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswIslands.c"
                  ,0x154,"Vec_Int_t *Ssw_MatchingPairs(Aig_Man_t *, Aig_Man_t *)");
  }
  pVVar8 = p0->vObjs;
  iVar1 = pVVar8->nSize;
  iVar7 = iVar1 - p0->nDeleted;
  if (iVar7 == p1->vObjs->nSize - p1->nDeleted) {
    p = (Vec_Int_t *)malloc(0x10);
    iVar5 = 0x10;
    if (0xe < iVar7 * 2 - 1U) {
      iVar5 = iVar7 * 2;
    }
    p->nSize = 0;
    p->nCap = iVar5;
    if (iVar5 == 0) {
      piVar4 = (int *)0x0;
    }
    else {
      piVar4 = (int *)malloc((long)iVar5 << 2);
    }
    p->pArray = piVar4;
    if (0 < iVar1) {
      lVar6 = 0;
      do {
        pvVar2 = pVVar8->pArray[lVar6];
        if ((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x18) & 7) != 3)) {
          lVar3 = *(long *)((long)pvVar2 + 0x28);
          Vec_IntPush(p,*(int *)((long)pvVar2 + 0x24));
          Vec_IntPush(p,*(int *)(lVar3 + 0x24));
          pVVar8 = p0->vObjs;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar8->nSize);
    }
    return p;
  }
  __assert_fail("Aig_ManObjNum(p0) == Aig_ManObjNum(p1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswIslands.c"
                ,0x155,"Vec_Int_t *Ssw_MatchingPairs(Aig_Man_t *, Aig_Man_t *)");
}

Assistant:

Vec_Int_t * Ssw_MatchingPairs( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Vec_Int_t * vPairsNew;
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    // check correctness
    assert( Aig_ManCiNum(p0) == Aig_ManCiNum(p1) );
    assert( Aig_ManCoNum(p0) == Aig_ManCoNum(p1) );
    assert( Aig_ManRegNum(p0) == Aig_ManRegNum(p1) );
    assert( Aig_ManObjNum(p0) == Aig_ManObjNum(p1) );
    // create complete pairs
    vPairsNew = Vec_IntAlloc( 2*Aig_ManObjNum(p0) );
    Aig_ManForEachObj( p0, pObj0, i )
    {
        if ( Aig_ObjIsCo(pObj0) )
            continue;
        pObj1 = (Aig_Obj_t *)pObj0->pData;
        Vec_IntPush( vPairsNew, pObj0->Id );
        Vec_IntPush( vPairsNew, pObj1->Id );
    }
    return vPairsNew;
}